

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::assessSmallValues
          (HighsSparseMatrix *this,HighsLogOptions *log_options,double small_matrix_value)

{
  size_type sVar1;
  double *pdVar2;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  HighsInt iX;
  HighsInt num_values;
  double min_value;
  string *in_stack_00000338;
  undefined1 in_stack_00000347;
  vector<double,_std::allocator<double>_> *in_stack_00000348;
  HighsInt in_stack_00000354;
  string *in_stack_00000358;
  HighsLogOptions *in_stack_00000360;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  double local_30;
  int local_28;
  int local_24;
  double local_20;
  double local_18;
  
  local_20 = INFINITY;
  local_18 = in_XMM0_Qa;
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58));
  local_24 = (int)sVar1;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x58);
    std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_28);
    std::abs((int)this_00);
    pdVar2 = std::min<double>(&local_30,&local_20);
    local_20 = *pdVar2;
  }
  if (local_20 <= local_18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Small values in matrix",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    analyseVectorValues(in_stack_00000360,in_stack_00000358,in_stack_00000354,in_stack_00000348,
                        (bool)in_stack_00000347,in_stack_00000338);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void HighsSparseMatrix::assessSmallValues(const HighsLogOptions& log_options,
                                          const double small_matrix_value) {
  double min_value = kHighsInf;
  const HighsInt num_values = this->value_.size();
  for (HighsInt iX = 0; iX < num_values; iX++)
    min_value = std::min(std::abs(this->value_[iX]), min_value);
  if (min_value > small_matrix_value) return;
  analyseVectorValues(&log_options, "Small values in matrix", num_values,
                      this->value_, false, "");
}